

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flow_cutter.h
# Opt level: O1

void __thiscall
flow_cutter::ReachableNodeSet::
ReachableNodeSet<flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Capacity,flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>>>>
          (ReachableNodeSet *this,
          Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Capacity,_flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>_>_>
          *graph)

{
  int iVar1;
  int *piVar2;
  ulong uVar3;
  
  (this->node_set).node_count_inside_ = 0;
  TinyIntIDFunc<1>::TinyIntIDFunc
            (&(this->node_set).inside_flag,(graph->tail).original_node_count * 2);
  (this->node_set).extra_node = -1;
  iVar1 = (graph->tail).original_node_count;
  (this->predecessor).preimage_count_ = iVar1 * 2;
  if ((long)iVar1 == 0) {
    piVar2 = (int *)0x0;
  }
  else {
    uVar3 = 0xffffffffffffffff;
    if (-1 < iVar1) {
      uVar3 = (long)iVar1 << 3;
    }
    piVar2 = (int *)operator_new__(uVar3);
  }
  (this->predecessor).data_ = piVar2;
  return;
}

Assistant:

explicit ReachableNodeSet(const Graph& graph)
        : node_set(graph)
        , predecessor(graph.node_count())
    {
    }